

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode setup_connection_internals(connectdata *conn)

{
  SessionHandle *data_00;
  CURLcode CVar1;
  SessionHandle *data;
  Curl_handler *pCStack_20;
  CURLcode result;
  Curl_handler *p;
  connectdata *conn_local;
  
  data_00 = conn->data;
  Curl_free_request_state(data_00);
  memset(&data_00->req,0,0x138);
  (data_00->req).maxdownload = -1;
  conn->socktype = 1;
  pCStack_20 = conn->handler;
  if (pCStack_20->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
    CVar1 = (*pCStack_20->setup_connection)(conn);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    pCStack_20 = conn->handler;
  }
  if (conn->port < 0) {
    conn->port = pCStack_20->defport;
  }
  if (conn->remote_port < 0) {
    conn->remote_port = (uint)conn->given->defport & 0xffff;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode setup_connection_internals(struct connectdata *conn)
{
  const struct Curl_handler * p;
  CURLcode result;
  struct SessionHandle *data = conn->data;

  /* in some case in the multi state-machine, we go back to the CONNECT state
     and then a second (or third or...) call to this function will be made
     without doing a DISCONNECT or DONE in between (since the connection is
     yet in place) and therefore this function needs to first make sure
     there's no lingering previous data allocated. */
  Curl_free_request_state(data);

  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.maxdownload = -1;

  conn->socktype = SOCK_STREAM; /* most of them are TCP streams */

  /* Perform setup complement if some. */
  p = conn->handler;

  if(p->setup_connection) {
    result = (*p->setup_connection)(conn);

    if(result != CURLE_OK)
      return result;

    p = conn->handler;              /* May have changed. */
  }

  if(conn->port < 0)
    /* we check for -1 here since if proxy was detected already, this
       was very likely already set to the proxy port */
    conn->port = p->defport;

  /* only if remote_port was not already parsed off the URL we use the
     default port number */
  if(conn->remote_port < 0)
    conn->remote_port = (unsigned short)conn->given->defport;

  return CURLE_OK;
}